

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
print_info::perform(print_info *this,filesystemcollection *fslist,readercollection *rdlist)

{
  readercollection *this_00;
  size_t sVar1;
  allocator<char> local_41;
  string local_40;
  readercollection *local_20;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  print_info *this_local;
  
  local_20 = rdlist;
  rdlist_local = (readercollection *)fslist;
  fslist_local = (filesystemcollection *)this;
  sVar1 = readercollection::count(rdlist);
  printf("readers: ( total = %d )\n",sVar1 & 0xffffffff);
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  readercollection::printreadertree(this_00,&local_40,0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar1 = filesystemcollection::count((filesystemcollection *)rdlist_local);
  printf("filesystems: ( total = %d )\n",sVar1 & 0xffffffff);
  filesystemcollection::
  enumerate_filesystems<print_info::perform(filesystemcollection&,readercollection&)::_lambda(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)_1_>
            ((filesystemcollection *)rdlist_local);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        printf("readers: ( total = %d )\n", (int)rdlist.count());
        rdlist.printreadertree("", 0);
        printf("filesystems: ( total = %d )\n", (int)fslist.count());
        fslist.enumerate_filesystems([](const std::string& name, FileContainer_ptr fs) {
            printf("    %-10s  %s\n", name.c_str(), fs->infostring().c_str());
        });
    }